

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ecp_id_GostR3410_2001_TestParamSet.c
# Opt level: O1

void fiat_id_GostR3410_2001_TestParamSet_add(uint64_t *out1,uint64_t *arg1,uint64_t *arg2)

{
  ulong uVar1;
  ulong uVar2;
  ulong uVar3;
  ulong uVar4;
  ulong uVar5;
  ulong uVar6;
  ulong uVar7;
  ulong uVar8;
  ulong uVar9;
  ulong uVar10;
  ulong uVar11;
  
  uVar8 = *arg2 + *arg1;
  uVar1 = (ulong)CARRY8(*arg2,*arg1);
  uVar6 = arg1[1] + uVar1;
  uVar2 = arg2[2] + arg1[2];
  uVar4 = (ulong)CARRY8(arg2[2],arg1[2]);
  uVar9 = arg2[3] + arg1[3];
  uVar5 = (ulong)CARRY8(arg1[1],uVar1);
  uVar7 = uVar6 + arg2[1];
  uVar1 = (ulong)CARRY8(uVar6,arg2[1]);
  uVar6 = uVar2 + uVar5;
  uVar3 = uVar6 + uVar1;
  uVar1 = (ulong)(CARRY8(uVar2,uVar5) || CARRY8(uVar6,uVar1));
  uVar6 = uVar4 + uVar9;
  uVar2 = uVar6 + uVar1;
  uVar5 = (ulong)(byte)-((0x430 < uVar8) + -1);
  uVar10 = (ulong)(uVar7 < uVar5);
  uVar11 = (ulong)(uVar3 < uVar10) | 0x8000000000000000;
  uVar1 = -(ulong)((byte)(CARRY8(arg2[3],arg1[3]) + (CARRY8(uVar4,uVar9) || CARRY8(uVar6,uVar1))) <
                  (uVar2 < uVar11));
  uVar6 = ~uVar1;
  *out1 = uVar8 - 0x431 & uVar6 | uVar8 & uVar1;
  out1[1] = uVar7 - uVar5 & uVar6 | uVar7 & uVar1;
  out1[2] = uVar3 - uVar10 & uVar6 | uVar3 & uVar1;
  out1[3] = uVar6 & uVar2 - uVar11 | uVar1 & uVar2;
  return;
}

Assistant:

static void fiat_id_GostR3410_2001_TestParamSet_add(uint64_t out1[4],
                                                    const uint64_t arg1[4],
                                                    const uint64_t arg2[4]) {
    uint64_t x1;
    fiat_id_GostR3410_2001_TestParamSet_uint1 x2;
    uint64_t x3;
    fiat_id_GostR3410_2001_TestParamSet_uint1 x4;
    uint64_t x5;
    fiat_id_GostR3410_2001_TestParamSet_uint1 x6;
    uint64_t x7;
    fiat_id_GostR3410_2001_TestParamSet_uint1 x8;
    uint64_t x9;
    fiat_id_GostR3410_2001_TestParamSet_uint1 x10;
    uint64_t x11;
    fiat_id_GostR3410_2001_TestParamSet_uint1 x12;
    uint64_t x13;
    fiat_id_GostR3410_2001_TestParamSet_uint1 x14;
    uint64_t x15;
    fiat_id_GostR3410_2001_TestParamSet_uint1 x16;
    uint64_t x17;
    fiat_id_GostR3410_2001_TestParamSet_uint1 x18;
    uint64_t x19;
    uint64_t x20;
    uint64_t x21;
    uint64_t x22;
    fiat_id_GostR3410_2001_TestParamSet_addcarryx_u64(&x1, &x2, 0x0, (arg1[0]),
                                                      (arg2[0]));
    fiat_id_GostR3410_2001_TestParamSet_addcarryx_u64(&x3, &x4, x2, (arg1[1]),
                                                      (arg2[1]));
    fiat_id_GostR3410_2001_TestParamSet_addcarryx_u64(&x5, &x6, x4, (arg1[2]),
                                                      (arg2[2]));
    fiat_id_GostR3410_2001_TestParamSet_addcarryx_u64(&x7, &x8, x6, (arg1[3]),
                                                      (arg2[3]));
    fiat_id_GostR3410_2001_TestParamSet_subborrowx_u64(&x9, &x10, 0x0, x1,
                                                       UINT16_C(0x431));
    fiat_id_GostR3410_2001_TestParamSet_subborrowx_u64(&x11, &x12, x10, x3,
                                                       0x0);
    fiat_id_GostR3410_2001_TestParamSet_subborrowx_u64(&x13, &x14, x12, x5,
                                                       0x0);
    fiat_id_GostR3410_2001_TestParamSet_subborrowx_u64(
        &x15, &x16, x14, x7, UINT64_C(0x8000000000000000));
    fiat_id_GostR3410_2001_TestParamSet_subborrowx_u64(&x17, &x18, x16, x8,
                                                       0x0);
    fiat_id_GostR3410_2001_TestParamSet_cmovznz_u64(&x19, x18, x9, x1);
    fiat_id_GostR3410_2001_TestParamSet_cmovznz_u64(&x20, x18, x11, x3);
    fiat_id_GostR3410_2001_TestParamSet_cmovznz_u64(&x21, x18, x13, x5);
    fiat_id_GostR3410_2001_TestParamSet_cmovznz_u64(&x22, x18, x15, x7);
    out1[0] = x19;
    out1[1] = x20;
    out1[2] = x21;
    out1[3] = x22;
}